

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

tuple<long,_double,_double> * __thiscall
fasttext::FastText::test(FastText *this,istream *in,int32_t k,real threshold)

{
  tuple<long,_double,_double> *this_00;
  Meter *in_RDX;
  undefined8 in_RSI;
  istream *in_RDI;
  unsigned_long *__elements;
  Meter *this_01;
  FastText *unaff_retaddr;
  Meter meter;
  double *in_stack_ffffffffffffff08;
  Meter *in_stack_ffffffffffffff10;
  Meter local_90;
  istream *in_00;
  
  in_00 = in_RDI;
  Meter::Meter(in_stack_ffffffffffffff10);
  test(unaff_retaddr,in_00,(int32_t)((ulong)in_RSI >> 0x20),(real)in_RSI,in_RDX);
  this_00 = (tuple<long,_double,_double> *)Meter::nexamples(&local_90);
  __elements = (unsigned_long *)Meter::precision((Meter *)0x1ad186);
  this_01 = (Meter *)Meter::recall((Meter *)0x1ad1a4);
  std::tuple<long,_double,_double>::tuple<unsigned_long,_double,_double,_true,_true>
            (this_00,__elements,(double *)this_01,in_stack_ffffffffffffff08);
  Meter::~Meter(this_01);
  return (tuple<long,_double,_double> *)in_RDI;
}

Assistant:

std::tuple<int64_t, double, double>
FastText::test(std::istream& in, int32_t k, real threshold) {
  Meter meter;
  test(in, k, threshold, meter);

  return std::tuple<int64_t, double, double>(
      meter.nexamples(), meter.precision(), meter.recall());
}